

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O1

ngx_int_t ngx_copy_file(u_char *from,u_char *to,ngx_copy_file_t *cf)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int __fd;
  void *__buf;
  size_t sVar4;
  ngx_int_t nVar5;
  int *piVar6;
  char *pcVar7;
  int err;
  size_t sVar8;
  size_t sVar9;
  ngx_log_t *pnVar10;
  ngx_uint_t nVar11;
  u_char *puVar12;
  size_t size;
  undefined1 local_e8 [8];
  ngx_file_info_t fi;
  
  iVar2 = open64((char *)from,0,0);
  fi.__glibc_reserved[2] = (__syscall_slong_t)cf;
  if (iVar2 == -1) {
    pnVar10 = cf->log;
    if (pnVar10->log_level < 3) {
LAB_0011b38f:
      __fd = -1;
      nVar5 = -1;
      __buf = (void *)0x0;
      goto LAB_0011b478;
    }
    piVar6 = __errno_location();
    iVar3 = *piVar6;
    pcVar7 = "open() \"%s\" failed";
    nVar11 = 3;
  }
  else {
    sVar8 = cf->size;
    if ((cf->size != 0xffffffffffffffff) ||
       (iVar3 = fstat64(iVar2,(stat64 *)local_e8), sVar8 = fi.st_rdev, iVar3 != -1)) {
      size = 0x10000;
      if (cf->buf_size != 0) {
        size = cf->buf_size;
      }
      if ((long)sVar8 <= (long)size) {
        size = sVar8;
      }
      __buf = ngx_alloc(size,cf->log);
      iVar3 = -1;
      if (__buf == (void *)0x0) {
        __buf = (void *)0x0;
        __fd = iVar3;
      }
      else {
        __fd = open64((char *)to,0x41,cf->access);
        if (__fd == -1) {
          pnVar10 = cf->log;
          __fd = iVar3;
          if (2 < pnVar10->log_level) {
            piVar6 = __errno_location();
            err = *piVar6;
            pcVar7 = "open() \"%s\" failed";
            nVar11 = 3;
LAB_0011b34a:
            ngx_log_error_core(nVar11,pnVar10,err,pcVar7,to);
            __fd = iVar3;
          }
        }
        else {
          if (0 < (long)sVar8) {
            do {
              if ((long)sVar8 <= (long)size) {
                size = sVar8;
              }
              sVar4 = read(iVar2,__buf,size);
              if (sVar4 == 0xffffffffffffffff) {
                pnVar10 = cf->log;
                if (1 < pnVar10->log_level) {
                  piVar6 = __errno_location();
                  iVar3 = *piVar6;
                  pcVar7 = "pread() \"%s\" failed";
                  puVar12 = from;
LAB_0011b42f:
                  ngx_log_error_core(2,pnVar10,iVar3,pcVar7 + 1,puVar12);
                }
                goto LAB_0011b471;
              }
              if (sVar4 != size) {
                if (1 < cf->log->log_level) {
                  ngx_log_error_core(2,cf->log,0,"read() has read only %z of %O from %s",sVar4,sVar8
                                     ,from);
                }
                goto LAB_0011b471;
              }
              sVar4 = write(__fd,__buf,size);
              if (sVar4 == 0xffffffffffffffff) {
                pnVar10 = cf->log;
                if (1 < pnVar10->log_level) {
                  piVar6 = __errno_location();
                  iVar3 = *piVar6;
                  pcVar7 = "pwrite() \"%s\" failed";
                  puVar12 = to;
                  goto LAB_0011b42f;
                }
                goto LAB_0011b471;
              }
              if (sVar4 != size) {
                if (1 < cf->log->log_level) {
                  ngx_log_error_core(2,cf->log,0,"write() has written only %z of %O to %s",sVar4,
                                     sVar8,to);
                }
                goto LAB_0011b471;
              }
              sVar9 = sVar8 - sVar4;
              bVar1 = (long)sVar4 <= (long)sVar8;
              sVar8 = sVar9;
            } while (sVar9 != 0 && bVar1);
          }
          if (cf->time == -1) {
            nVar5 = 0;
            goto LAB_0011b478;
          }
          nVar5 = ngx_set_file_time(to,__fd,cf->time);
          if (nVar5 == 0) {
            nVar5 = 0;
            goto LAB_0011b478;
          }
          pnVar10 = cf->log;
          if (1 < pnVar10->log_level) {
            piVar6 = __errno_location();
            err = *piVar6;
            pcVar7 = "utimes() \"%s\" failed";
            nVar11 = 2;
            iVar3 = __fd;
            goto LAB_0011b34a;
          }
        }
      }
LAB_0011b471:
      nVar5 = -1;
      goto LAB_0011b478;
    }
    pnVar10 = cf->log;
    if (pnVar10->log_level < 2) goto LAB_0011b38f;
    piVar6 = __errno_location();
    iVar3 = *piVar6;
    pcVar7 = "fstat() \"%s\" failed";
    nVar11 = 2;
  }
  __buf = (void *)0x0;
  __fd = -1;
  nVar5 = -1;
  ngx_log_error_core(nVar11,pnVar10,iVar3,pcVar7,from);
LAB_0011b478:
  if (((__fd != -1) && (iVar3 = close(__fd), iVar3 == -1)) &&
     (pnVar10 = *(ngx_log_t **)(fi.__glibc_reserved[2] + 0x20), 1 < pnVar10->log_level)) {
    piVar6 = __errno_location();
    ngx_log_error_core(2,pnVar10,*piVar6,"close() \"%s\" failed",to);
  }
  if (((iVar2 != -1) && (iVar2 = close(iVar2), iVar2 == -1)) &&
     (pnVar10 = *(ngx_log_t **)(fi.__glibc_reserved[2] + 0x20), 1 < pnVar10->log_level)) {
    piVar6 = __errno_location();
    ngx_log_error_core(2,pnVar10,*piVar6,"close() \"%s\" failed",from);
  }
  if (__buf != (void *)0x0) {
    free(__buf);
  }
  return nVar5;
}

Assistant:

ngx_int_t
ngx_copy_file(u_char *from, u_char *to, ngx_copy_file_t *cf)
{
    char             *buf;
    off_t             size;
    size_t            len;
    ssize_t           n;
    ngx_fd_t          fd, nfd;
    ngx_int_t         rc;
    ngx_file_info_t   fi;

    rc = NGX_ERROR;
    buf = NULL;
    nfd = NGX_INVALID_FILE;

    fd = ngx_open_file(from, NGX_FILE_RDONLY, NGX_FILE_OPEN, 0);

    if (fd == NGX_INVALID_FILE) {
        ngx_log_error(NGX_LOG_CRIT, cf->log, ngx_errno,
                      ngx_open_file_n " \"%s\" failed", from);
        goto failed;
    }

    if (cf->size != -1) {
        size = cf->size;

    } else {
        if (ngx_fd_info(fd, &fi) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_fd_info_n " \"%s\" failed", from);

            goto failed;
        }

        size = ngx_file_size(&fi);
    }

    len = cf->buf_size ? cf->buf_size : 65536;

    if ((off_t) len > size) {
        len = (size_t) size;
    }

    buf = ngx_alloc(len, cf->log);
    if (buf == NULL) {
        goto failed;
    }

    nfd = ngx_open_file(to, NGX_FILE_WRONLY, NGX_FILE_CREATE_OR_OPEN,
                        cf->access);

    if (nfd == NGX_INVALID_FILE) {
        ngx_log_error(NGX_LOG_CRIT, cf->log, ngx_errno,
                      ngx_open_file_n " \"%s\" failed", to);
        goto failed;
    }

    while (size > 0) {

        if ((off_t) len > size) {
            len = (size_t) size;
        }

        n = ngx_read_fd(fd, buf, len);

        if (n == -1) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_read_fd_n " \"%s\" failed", from);
            goto failed;
        }

        if ((size_t) n != len) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, 0,
                          ngx_read_fd_n " has read only %z of %O from %s",
                          n, size, from);
            goto failed;
        }

        n = ngx_write_fd(nfd, buf, len);

        if (n == -1) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_write_fd_n " \"%s\" failed", to);
            goto failed;
        }

        if ((size_t) n != len) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, 0,
                          ngx_write_fd_n " has written only %z of %O to %s",
                          n, size, to);
            goto failed;
        }

        size -= n;
    }

    if (cf->time != -1) {
        if (ngx_set_file_time(to, nfd, cf->time) != NGX_OK) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_set_file_time_n " \"%s\" failed", to);
            goto failed;
        }
    }

    rc = NGX_OK;

failed:

    if (nfd != NGX_INVALID_FILE) {
        if (ngx_close_file(nfd) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_close_file_n " \"%s\" failed", to);
        }
    }

    if (fd != NGX_INVALID_FILE) {
        if (ngx_close_file(fd) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_close_file_n " \"%s\" failed", from);
        }
    }

    if (buf) {
        ngx_free(buf);
    }

    return rc;
}